

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhash.h
# Opt level: O2

mh_int_t mh_assoc_find(mh_assoc_t *h,assoc_key *key,void *arg)

{
  uint uVar1;
  mh_int_t *pmVar2;
  uint32_t uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar3 = PMurHash32(0xd,key->id,key->id_len);
  uVar1 = h->n_buckets;
  uVar7 = (ulong)uVar3 % (ulong)uVar1;
  pmVar2 = h->b;
  do {
    uVar6 = (uint)uVar7;
    uVar5 = pmVar2[uVar7 >> 4];
    if ((uVar5 >> (uVar6 & 0xf) & 1) != 0) {
      if ((key->id_len == (h->p[uVar7]->key).id_len) &&
         (iVar4 = bcmp(key->id,(h->p[uVar7]->key).id,(ulong)key->id_len), iVar4 == 0)) {
        return uVar6;
      }
    }
    if (((uVar5 >> (sbyte)(uVar6 & 0xf)) >> 0x10 & 1) == 0) {
      return uVar1;
    }
    uVar6 = uVar6 + uVar3 % (uVar1 - 1) + 1;
    uVar5 = uVar1;
    if (uVar6 < uVar1) {
      uVar5 = 0;
    }
    uVar7 = (ulong)(uVar6 - uVar5);
  } while( true );
}

Assistant:

static inline mh_int_t
_mh(find)(struct _mh(t) *h, mh_key_t key, mh_arg_t arg)
{
	(void) arg;

	mh_int_t k = mh_hash_key(key, arg);
	mh_int_t i = k % h->n_buckets;
	mh_int_t inc = 1 + k % (h->n_buckets - 1);
	for (;;) {
		if ((mh_exist(h, i) && mh_eq_key(key, mh_node(h, i), arg)))
			return i;

		if (!mh_dirty(h, i))
			return h->n_buckets;

		i = _mh(next_slot)(i, inc, h->n_buckets);
	}
}